

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

OLECHAR __thiscall
UTF8EncodingPolicyBase<false>::ReadSurrogatePairUpper
          (UTF8EncodingPolicyBase<false> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  byte *pbVar1;
  EncodedCharPtr puVar2;
  code *pcVar3;
  bool bVar4;
  char16 cVar5;
  undefined4 *puVar6;
  
  pbVar1 = *p;
  *p = pbVar1 + 1;
  if (pbVar1 < last) {
    cVar5 = (char16)*pbVar1;
  }
  else {
    cVar5 = L'\0';
  }
  if ((ushort)cVar5 < 0x80) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0xea,"(IsMultiUnitChar(ch))","IsMultiUnitChar(ch)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  *(undefined1 *)&this->m_decodeOptions = (char)this->m_decodeOptions | doSecondSurrogatePair;
  puVar2 = *p;
  cVar5 = utf8::DecodeTail(cVar5,p,last,&this->m_decodeOptions,(bool *)0x0);
  this->m_cMultiUnits = (size_t)(*p + (this->m_cMultiUnits - (long)puVar2));
  return cVar5;
}

Assistant:

OLECHAR ReadSurrogatePairUpper(EncodedCharPtr &p, EncodedCharPtr last)
    {
        EncodedChar ch = (nullTerminated || p < last) ? *p++ : (p++, 0);
        Assert(IsMultiUnitChar(ch));
        this->m_decodeOptions |= utf8::DecodeOptions::doSecondSurrogatePair;
        return ReadRest<true>(ch, p, last);
    }